

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmp_math.cpp
# Opt level: O2

double getCorrelationCoefficient3d(TRIPLERGB **mrx,int h,int w,int component,int y,int x)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  int j;
  int w_00;
  int j_00;
  int iVar5;
  int iVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 uStack_60;
  
  if (y < 0) {
    w_00 = w - x;
    local_88 = getExpection(mrx,h,w_00,component,-y,0);
    iVar6 = y + h;
    iVar5 = 0;
  }
  else {
    w_00 = w - x;
    local_88 = getExpection(mrx,h - y,w_00,component,0,0);
    iVar6 = h;
    iVar5 = y;
  }
  dVar7 = getExpection(mrx,iVar6,w,component,iVar5,x);
  uVar3 = -y;
  if (0 < y) {
    uVar3 = y;
  }
  iVar6 = h - uVar3;
  if (w_00 < 1) {
    w_00 = 0;
  }
  if (iVar6 < 1) {
    iVar6 = 0;
  }
  iVar5 = y;
  if (y < 1) {
    iVar5 = 0;
  }
  local_68 = 0.0;
  uStack_60 = 0.0;
  local_78 = 0.0;
  for (iVar4 = 0; iVar4 != iVar6; iVar4 = iVar4 + 1) {
    for (j_00 = 0; w_00 != j_00; j_00 = j_00 + 1) {
      bVar1 = getComponent((TRIPLEBYTES **)mrx,(y >> 0x1f & uVar3) + iVar4,j_00,component);
      bVar2 = getComponent((TRIPLEBYTES **)mrx,iVar4 + iVar5,j_00 + x,component);
      dVar8 = (double)bVar1 - local_88;
      dVar9 = (double)bVar2 - dVar7;
      local_78 = local_78 + dVar9 * dVar8;
      local_68 = local_68 + dVar8 * dVar8;
      uStack_60 = uStack_60 + dVar9 * dVar9;
    }
  }
  uStack_60 = uStack_60 * local_68;
  if (uStack_60 < 0.0) {
    uStack_60 = sqrt(uStack_60);
  }
  else {
    uStack_60 = SQRT(uStack_60);
  }
  return local_78 / uStack_60;
}

Assistant:

double getCorrelationCoefficient3d(TRIPLERGB **mrx, int h, int w, int component, int y, int x) {
    double Exp1;
    double Exp2;
    if (y < 0) {
        Exp1 = getExpection(mrx, h, w - x, component, abs(y), 0);
        Exp2 = getExpection(mrx, h - abs(y), w, component, 0, x);
    } else {
        Exp1 = getExpection(mrx, h - y, w - x, component);
        Exp2 = getExpection(mrx, h, w, component, y, x);
    }
    double count = 0;
    double count1 = 0;
    double count2 = 0;
    double countSqr1 = 0;
    double countSqr2 = 0;
    for (int i = 0; i < h - abs(y); i++) {
        for (int j = 0; j < w - x; j++) {
            if (y < 0) {
                count1 = (double) getComponent((TRIPLEBYTES **) mrx, abs(y) + i, j, component) - Exp1;
                count2 = (double) getComponent((TRIPLEBYTES **) mrx, i, x + j, component) - Exp2;
            } else {
                count1 = (double) getComponent((TRIPLEBYTES **) mrx, i, j, component) - Exp1;
                count2 = (double) getComponent((TRIPLEBYTES **) mrx, y + i, x + j, component) - Exp2;
            }
            count += count1 * count2;
            countSqr1 += pow(count1, 2);
            countSqr2 += pow(count2, 2);
        }
    }
    return count / sqrt(countSqr1 * countSqr2);
}